

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tct3img.cpp
# Opt level: O2

void __thiscall
CTcGenTarg::write_nontads_objs_to_image
          (CTcGenTarg *this,CTcDataStream *os,CVmImageWriter *image_writer,int meta_idx,
          int large_objs)

{
  uint uVar1;
  int iVar2;
  char *buf;
  ulong uVar3;
  uint uVar4;
  ulong ofs;
  uint object_count;
  ulong avail_len;
  uint32_t local_40;
  undefined4 uStack_3c;
  ulong local_38;
  
  ofs = 0;
  do {
    uVar3 = os->ofs_;
    if (uVar3 <= ofs) {
      return;
    }
    object_count = 0;
    while (ofs < uVar3) {
      if (large_objs == 0) {
        iVar2 = CTcDataStream::read2_at(os,ofs + 4);
        uVar4 = iVar2 + 6;
        if ((object_count != 0) && (64000 < uVar4)) goto LAB_001e526d;
      }
      else {
        uVar1 = CTcDataStream::readu4_at(os,ofs + 4);
        uVar4 = uVar1 + 8;
      }
      if (object_count == 0) {
        CVmImageWriter::begin_objs_block(image_writer,meta_idx,large_objs,0);
      }
      local_38 = ofs;
      for (uVar3 = (ulong)uVar4; uVar3 != 0; uVar3 = uVar3 - CONCAT44(uStack_3c,local_40)) {
        buf = CTcDataStream::get_block_ptr(os,ofs,uVar3,(ulong *)&local_40);
        CVmImageWriter::write_objs_bytes(image_writer,buf,local_40);
        ofs = ofs + CONCAT44(uStack_3c,local_40);
      }
      object_count = object_count + 1;
      uVar3 = os->ofs_;
      ofs = local_38 + uVar4;
    }
    if (object_count != 0) {
LAB_001e526d:
      CVmImageWriter::end_objs_block(image_writer,object_count);
    }
  } while( true );
}

Assistant:

void CTcGenTarg::write_nontads_objs_to_image(CTcDataStream *os,
                                             CVmImageWriter *image_writer,
                                             int meta_idx, int large_objs)
{
    /* keep going until we've written the whole file */
    for (ulong start_ofs = 0 ; start_ofs < os->get_ofs() ; )
    {
        ulong ofs;
        uint siz;
        uint cnt;
        uint block_size;

        /* 
         *   Scan the stream.  Each entry in the stream is either a small or
         *   large object record, which means that it starts with the object
         *   ID (UINT4) and the length (UINT2 for small, UINT4 for large) of
         *   the metaclass-specific data, which is then followed by the
         *   metaclass data.
         *   
         *   Include as many objects as we can while staying within our
         *   approximately 64k limit, if this is a small-format block; fill
         *   the block without limit if this is a large-format block.  
         */
        for (block_size = 0, ofs = start_ofs, cnt = 0 ; ; )
        {
            ulong rem_len;
            ulong next_ofs;

            /* if we've reached the end of the stream, we're done */
            if (ofs >= os->get_ofs())
                break;

            /* 
             *   get the size of this block - this is the
             *   metaclass-specific data size at offset 4 in the T3
             *   metaclass header, plus the size of the T3 metaclass
             *   header 
             */
            if (large_objs)
            {
                /* 
                 *   Get the 32-bit size value.  Note that we don't worry
                 *   about limiting the overall block size to 64k when we're
                 *   writing a "large" object block.  
                 */
                siz = (ulong)os->readu4_at(ofs + 4)
                      + TCT3_LARGE_META_HEADER_SIZE;
            }
            else
            {
                /* get the 16-bit size value */
                siz = (ulong)os->read2_at(ofs + 4)
                      + TCT3_META_HEADER_SIZE;

                /* 
                 *   Since this is a small-object block, limit the aggregate
                 *   size of the entire block to 64k.  So, if this block
                 *   would push us over the 64k aggregate for the block,
                 *   start a new OBJS block with this object.  
                 */
                if (cnt != 0 && block_size + siz > 64000L)
                    break;
            }

            /* 
             *   if this is the first object in this block, write the
             *   block header - the dictionary uses large object headers,
             *   so note that 
             */
            if (cnt == 0)
                image_writer->begin_objs_block(meta_idx, large_objs, FALSE);

            /* calculate the offset of the next block */
            next_ofs = ofs + siz;

            /* write the object data */
            for (rem_len = siz ; rem_len != 0 ; )
            {
                const char *p;
                ulong avail_len;

                /* get the next block */
                p = os->get_block_ptr(ofs, rem_len, &avail_len);

                /* write it out */
                image_writer->write_objs_bytes(p, avail_len);
                
                /* move past this block */
                ofs += avail_len;
                rem_len -= avail_len;
            }
                
            /* count the object */
            ++cnt;

            /* move on to the next block */
            ofs = next_ofs;
        }

        /* if we wrote any objects, end the block */
        if (cnt != 0)
            image_writer->end_objs_block(cnt);

        /* move on to the next block */
        start_ofs = ofs;
    }
}